

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_whitelist_signature_parse
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,uchar *input,
              size_t input_len)

{
  byte bVar1;
  long lVar2;
  
  if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_whitelist_signature_parse_cold_2();
  }
  else {
    if (input != (uchar *)0x0) {
      if (input_len == 0) {
        return 0;
      }
      bVar1 = *input;
      sig->n_keys = (ulong)bVar1;
      lVar2 = (ulong)bVar1 * 0x20;
      if (lVar2 + 0x21U != input_len) {
        return 0;
      }
      memcpy(sig->data,input + 1,lVar2 + 0x20);
      return 1;
    }
    secp256k1_whitelist_signature_parse_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_whitelist_signature_parse(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const unsigned char *input, size_t input_len) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input != NULL);

    if (input_len == 0) {
        return 0;
    }

    sig->n_keys = input[0];
    if (sig->n_keys >= MAX_KEYS || input_len != 1 + 32 * (sig->n_keys + 1)) {
        return 0;
    }
    memcpy(&sig->data[0], &input[1], 32 * (sig->n_keys + 1));

    return 1;
}